

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntGrow(Vec_Int_t *p,int nCapMin)

{
  int *piVar1;
  
  if (p->nCap < nCapMin) {
    if (p->pArray == (int *)0x0) {
      piVar1 = (int *)malloc((ulong)(uint)nCapMin << 2);
    }
    else {
      piVar1 = (int *)realloc(p->pArray,(ulong)(uint)nCapMin << 2);
    }
    p->pArray = piVar1;
    if (piVar1 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = nCapMin;
  }
  return;
}

Assistant:

static inline void Vec_IntGrow( Vec_Int_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    p->pArray = ABC_REALLOC( int, p->pArray, nCapMin ); 
    assert( p->pArray );
    p->nCap   = nCapMin;
}